

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

bool Js::VarIsImpl<Js::TypedArray<unsigned_long,false,false>>(RecyclableObject *obj)

{
  Type TVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00d555a9;
    *puVar6 = 0;
  }
  TVar1 = ((obj->type).ptr)->typeId;
  if ((int)TVar1 < 0x58) {
    if (TVar1 == TypeIds_Uint64Array) {
      pp_Var2 = (obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject;
      if (pp_Var2 ==
          (_func_int **)VirtualTableInfo<Js::TypedArray<unsigned_long,_false,_false>_>::Address) {
        return true;
      }
      return pp_Var2 ==
             (_func_int **)
             VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_long,_false,_false>_>_>::
             Address;
    }
  }
  else {
    BVar5 = RecyclableObject::IsExternal(obj);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) {
LAB_00d555a9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  return false;
}

Assistant:

bool VarIsImpl<Uint64Array>(RecyclableObject* obj)
    {
        return JavascriptOperators::GetTypeId(obj) == TypeIds_Uint64Array &&
               ( VirtualTableInfo<Uint64Array>::HasVirtualTable(obj) ||
                 VirtualTableInfo<CrossSiteObject<Uint64Array>>::HasVirtualTable(obj)
               );
    }